

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.h
# Opt level: O0

bool __thiscall
spvtools::opt::BasicBlock::WhileEachInst
          (BasicBlock *this,function<bool_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  bool bVar1;
  pointer this_00;
  Instruction *pIVar2;
  Instruction *next_instruction;
  Instruction *inst;
  bool run_on_debug_line_insts_local;
  function<bool_(spvtools::opt::Instruction_*)> *f_local;
  BasicBlock *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->label_);
  if (bVar1) {
    this_00 = std::
              unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ::operator->(&this->label_);
    bVar1 = opt::Instruction::WhileEachInst(this_00,f,run_on_debug_line_insts);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = utils::IntrusiveList<spvtools::opt::Instruction>::empty
                    (&(this->insts_).super_IntrusiveList<spvtools::opt::Instruction>);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    next_instruction =
         utils::IntrusiveList<spvtools::opt::Instruction>::front
                   (&(this->insts_).super_IntrusiveList<spvtools::opt::Instruction>);
    do {
      if (next_instruction == (Instruction *)0x0) {
        return true;
      }
      pIVar2 = utils::IntrusiveNodeBase<spvtools::opt::Instruction>::NextNode
                         (&next_instruction->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
      bVar1 = opt::Instruction::WhileEachInst(next_instruction,f,run_on_debug_line_insts);
      next_instruction = pIVar2;
    } while (bVar1);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool BasicBlock::WhileEachInst(
    const std::function<bool(Instruction*)>& f, bool run_on_debug_line_insts) {
  if (label_) {
    if (!label_->WhileEachInst(f, run_on_debug_line_insts)) return false;
  }
  if (insts_.empty()) {
    return true;
  }

  Instruction* inst = &insts_.front();
  while (inst != nullptr) {
    Instruction* next_instruction = inst->NextNode();
    if (!inst->WhileEachInst(f, run_on_debug_line_insts)) return false;
    inst = next_instruction;
  }
  return true;
}